

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::render_scene(Application *this,string *saveFileLocation)

{
  PathTracer *this_00;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  timespec local_48;
  string local_38;
  
  set_up_pathtracer(this);
  PathTracer::start_raytracing(this->pathtracer);
  bVar2 = PathTracer::is_done(this->pathtracer);
  do {
    if (bVar2) {
      this_00 = this->pathtracer;
      pcVar1 = (saveFileLocation->_M_dataplus)._M_p;
      local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_38,pcVar1,pcVar1 + saveFileLocation->_M_string_length);
      PathTracer::save_image(this_00,&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p);
      }
      return;
    }
    local_48.tv_sec = 0;
    local_48.tv_nsec = 5000000;
    do {
      iVar3 = nanosleep(&local_48,&local_48);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    bVar2 = PathTracer::is_done(this->pathtracer);
  } while( true );
}

Assistant:

void Application::render_scene(std::string saveFileLocation) {

  set_up_pathtracer();
  pathtracer->start_raytracing();

  while(!pathtracer->is_done()) {
    std::this_thread::sleep_for(std::chrono::milliseconds(5));
  }

  pathtracer->save_image(saveFileLocation);
}